

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3ac2::SingleEvaluationTest_WriteTests_Test::TestBody
          (SingleEvaluationTest_WriteTests_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertionResult *pAVar3;
  char *pcVar4;
  FILE *pFVar5;
  string gtest_output;
  AssertionResult gtest_ar;
  string gtest_expected_output;
  OutputRedirect gtest_redir;
  AssertionResult gtest_ar_3;
  OutputRedirect gtest_redir_1;
  TestPartResultArray gtest_failures;
  undefined1 local_f8 [16];
  char local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  long local_a8 [4];
  undefined1 local_88 [32];
  AssertionResult local_68;
  OutputRedirect local_58;
  TestPartResultArray local_48;
  
  testing::AssertionSuccess();
  if (local_d8[0] == (string)0x1) {
    (anonymous_namespace)::SingleEvaluationTest::b_ =
         (anonymous_namespace)::SingleEvaluationTest::b_ + 1;
    local_b8 = (undefined1  [8])local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"test","");
    OutputRedirect::OutputRedirect((OutputRedirect *)local_88,_stdout);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (anonymous_namespace)::SingleEvaluationTest::a_ =
           (anonymous_namespace)::SingleEvaluationTest::a_ + 1;
      printf("test");
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)local_f8,(OutputRedirect *)local_88);
    pcVar4 = (char *)local_f8._0_8_;
    if ((pointer)local_f8._8_8_ == local_b0._M_p) {
      bVar1 = true;
      if ((pointer)local_f8._8_8_ != (pointer)0x0) {
        iVar2 = bcmp((void *)local_f8._0_8_,(void *)local_b8,local_f8._8_8_);
        if (iVar2 != 0) goto LAB_0010ef15;
      }
    }
    else {
LAB_0010ef15:
      pAVar3 = testing::AssertionResult::operator<<
                         ((AssertionResult *)local_d8,
                          (char (*) [59])
                          "{ a_++; std::printf(\"test\"); } produces different output.\n");
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x164425);
      pAVar3 = testing::AssertionResult::operator<<
                         (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b8);
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x164b12);
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x164419);
      testing::AssertionResult::operator<<
                (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f8);
      bVar1 = false;
      pcVar4 = (char *)local_f8._0_8_;
    }
    if (pcVar4 != local_e8) {
      operator_delete(pcVar4);
    }
    OutputRedirect::~OutputRedirect((OutputRedirect *)local_88);
    if (local_b8 != (undefined1  [8])local_a8) {
      operator_delete((void *)local_b8);
    }
    if (bVar1) goto LAB_0010f015;
  }
  testing::Message::Message((Message *)local_b8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._8_8_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((_Alloc_hider *)local_d8._8_8_)->_M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
             ,0xa1,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
  if (local_b8 != (undefined1  [8])0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_b8 != (undefined1  [8])0x0)) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
LAB_0010f015:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b8,"1","a_",(int *)local_f8,
             &(anonymous_namespace)::SingleEvaluationTest::a_);
  if (local_b8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_b0._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0xa2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if ((long *)local_f8._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_f8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b8,"1","b_",(int *)local_f8,
             &(anonymous_namespace)::SingleEvaluationTest::b_);
  if (local_b8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_b0._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0xa3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if ((long *)local_f8._0_8_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_f8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  do {
    local_48.array_.
    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.array_.
    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.array_.
    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8._0_8_ = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Actual: test","");
    testing::internal::SingleFailureChecker::SingleFailureChecker
              ((SingleFailureChecker *)local_b8,&local_48,kNonFatalFailure,(string *)local_f8);
    if ((char *)local_f8._0_8_ != local_e8) {
      operator_delete((void *)local_f8._0_8_);
    }
    testing::ScopedFakeTestPartResultReporter::ScopedFakeTestPartResultReporter
              ((ScopedFakeTestPartResultReporter *)local_f8,INTERCEPT_ONLY_CURRENT_THREAD,&local_48)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::AssertionSuccess();
      if (local_68.success_ == true) {
        (anonymous_namespace)::SingleEvaluationTest::b_ =
             (anonymous_namespace)::SingleEvaluationTest::b_ + 1;
        local_d8._0_8_ = (AssertHelperData *)(local_d8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"other","");
        OutputRedirect::OutputRedirect(&local_58,_stdout);
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          (anonymous_namespace)::SingleEvaluationTest::a_ =
               (anonymous_namespace)::SingleEvaluationTest::a_ + 1;
          printf("test");
        }
        OutputRedirect::restore_and_read_abi_cxx11_((string *)local_88,&local_58);
        pFVar5 = (FILE *)local_88._0_8_;
        if (local_88._8_8_ == local_d8._8_8_) {
          bVar1 = true;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            iVar2 = bcmp((void *)local_88._0_8_,(void *)local_d8._0_8_,local_88._8_8_);
            if (iVar2 != 0) goto LAB_0010f2ca;
          }
        }
        else {
LAB_0010f2ca:
          pAVar3 = testing::AssertionResult::operator<<
                             (&local_68,
                              (char (*) [59])
                              "{ a_++; std::printf(\"test\"); } produces different output.\n");
          pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x164425);
          pAVar3 = testing::AssertionResult::operator<<
                             (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d8);
          pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x164b12);
          pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x164419);
          testing::AssertionResult::operator<<
                    (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88);
          bVar1 = false;
          pFVar5 = (FILE *)local_88._0_8_;
        }
        if (pFVar5 != (FILE *)(local_88 + 0x10)) {
          operator_delete(pFVar5);
        }
        OutputRedirect::~OutputRedirect(&local_58);
        if ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        if (!bVar1) goto LAB_0010f370;
      }
      else {
LAB_0010f370:
        testing::Message::Message((Message *)local_d8);
        pcVar4 = "";
        if (local_68.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((local_68.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
                   ,0xa9,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
        if ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((AssertHelperData *)local_d8._0_8_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_d8._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    testing::ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter
              ((ScopedFakeTestPartResultReporter *)local_f8);
    testing::internal::SingleFailureChecker::~SingleFailureChecker((SingleFailureChecker *)local_b8)
    ;
    std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::~vector
              (&local_48.array_);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_f8._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_b8,"2","a_",(int *)local_f8,
                 &(anonymous_namespace)::SingleEvaluationTest::a_);
      if (local_b8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_f8);
        if (local_b0._M_p == (pointer)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_b0._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
                   ,0xaa,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
        if ((long *)local_f8._0_8_ != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_f8._0_8_ != (long *)0x0)) {
            (**(code **)(*(long *)local_f8._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_f8._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_b8,"2","b_",(int *)local_f8,
                 &(anonymous_namespace)::SingleEvaluationTest::b_);
      if (local_b8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_f8);
        if (local_b0._M_p == (pointer)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_b0._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
                   ,0xab,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
        if ((long *)local_f8._0_8_ != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_f8._0_8_ != (long *)0x0)) {
            (**(code **)(*(long *)local_f8._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  } while( true );
}

Assistant:

TEST_F(SingleEvaluationTest, WriteTests) {
  // successful EXPECT_WRITE
  EXPECT_WRITE(stdout, {  // NOLINT
    a_++;
    std::printf("test");
  }, (b_++, "test"));
  EXPECT_EQ(1, a_);
  EXPECT_EQ(1, b_);

  // failed EXPECT_WRITE
  EXPECT_NONFATAL_FAILURE(EXPECT_WRITE(stdout, {  // NOLINT
    a_++;
    std::printf("test");
  }, (b_++, "other")), "Actual: test");
  EXPECT_EQ(2, a_);
  EXPECT_EQ(2, b_);
}